

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_glyph_outline.cpp
# Opt level: O0

bool __thiscall ON_OutlineFigure::IsValidFigure(ON_OutlineFigure *this,bool bLogErrors)

{
  undefined8 uVar1;
  bool bVar2;
  ON__UINT32 OVar3;
  undefined8 *puVar4;
  ON_2fPoint *pOVar5;
  int local_68;
  uint local_64;
  int cv_dex;
  ON__UINT32 i;
  ON_OutlineFigurePoint p1;
  ON_OutlineFigurePoint p0;
  undefined1 auStack_40 [3];
  bool bClosedFigure;
  ON_OutlineFigurePoint figure_end;
  undefined1 auStack_30 [2];
  ON__UINT16 figure_id;
  ON_OutlineFigurePoint figure_start;
  ON_OutlineFigurePoint *a;
  ON__UINT32 figure_end_dex;
  bool bLogErrors_local;
  ON_OutlineFigure *this_local;
  
  OVar3 = Internal_FigureEndDex(this,bLogErrors);
  if (OVar3 == 0) {
    this_local._7_1_ = false;
  }
  else {
    figure_start.m_point = (ON_2fPoint)ON_SimpleArray<ON_OutlineFigurePoint>::Array(&this->m_points)
    ;
    unique0x00012000 = *(ON_2fPoint *)figure_start.m_point;
    figure_start._0_4_ = *(float *)((long)figure_start.m_point + 8);
    bVar2 = ON_OutlineFigurePoint::IsBeginFigurePoint
                      ((ON_OutlineFigurePoint *)&figure_end.m_point.y);
    if (bVar2) {
      if (figure_end.m_point.y._0_1_ == '\x01') {
        if (bLogErrors) {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_glyph_outline.cpp"
                     ,0xaa5,"",
                     "m_outline_points[figure_start_dex] is ON_OutlineFigurePoint::Type::BeginFigureUnknown."
                    );
        }
        this_local._7_1_ = false;
      }
      else {
        figure_end.m_point.x._2_2_ = figure_end.m_point.y._2_2_;
        if (figure_end.m_point.y._2_2_ == 0) {
          if (bLogErrors) {
            ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_glyph_outline.cpp"
                       ,0xaac,"","BeginFigure point has 0 = m_contour_index.");
          }
          this_local._7_1_ = false;
        }
        else {
          puVar4 = (undefined8 *)((long)figure_start.m_point + (ulong)OVar3 * 0xc);
          uVar1 = *puVar4;
          figure_end._0_4_ = *(undefined4 *)(puVar4 + 1);
          p0.m_point.y._2_2_ = (short)((ulong)uVar1 >> 0x10);
          unique0x10000771 = uVar1;
          if (figure_end.m_point.y._2_2_ == p0.m_point.y._2_2_) {
            bVar2 = ON_OutlineFigurePoint::IsOnFigure
                              ((ON_OutlineFigurePoint *)&figure_end.m_point.y);
            if (bVar2) {
              bVar2 = ON_OutlineFigurePoint::IsOnFigure((ON_OutlineFigurePoint *)&p0.m_point.y);
              if (bVar2) {
                p0.m_point.x._3_1_ = figure_end.m_point.y._0_1_ != '\x02';
                if ((bool)p0.m_point.x._3_1_) {
                  if (p0.m_point.y._0_1_ != '\f') {
                    if (bLogErrors) {
                      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_glyph_outline.cpp"
                                 ,0xac8,"",
                                 "Closed figure is not terminated with an EndFigureClosed point.");
                    }
                    return false;
                  }
                  bVar2 = ON_2fPoint::operator==((ON_2fPoint *)auStack_30,(ON_2fPoint *)auStack_40);
                  if (!bVar2) {
                    if (bLogErrors) {
                      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_glyph_outline.cpp"
                                 ,0xacd,"","Closed figure has different start and end points.");
                    }
                    return false;
                  }
                }
                else if (p0.m_point.y._0_1_ != '\v') {
                  if (bLogErrors) {
                    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_glyph_outline.cpp"
                               ,0xad5,"",
                               "Open figure is not terminated with an EndFigureOpen point.");
                  }
                  return false;
                }
                ON_OutlineFigurePoint::ON_OutlineFigurePoint((ON_OutlineFigurePoint *)&p1.m_point);
                ON_OutlineFigurePoint::ON_OutlineFigurePoint((ON_OutlineFigurePoint *)&cv_dex);
                _cv_dex = stack0xffffffffffffffcc;
                p1.m_point_type = figure_start.m_point_type;
                p1.m_point_proximity = figure_start.m_point_proximity;
                p1.m_figure_index = figure_start.m_figure_index;
                for (local_64 = 1; local_64 < OVar3; local_64 = local_64 + 1) {
                  p1.m_point = _cv_dex;
                  p0.m_point_type = p1.m_point_type;
                  p0.m_point_proximity = p1.m_point_proximity;
                  p0.m_figure_index = p1.m_figure_index;
                  pOVar5 = (ON_2fPoint *)((long)figure_start.m_point + (ulong)local_64 * 0xc);
                  _cv_dex = *pOVar5;
                  p1._0_4_ = pOVar5[1].x;
                  if (figure_end.m_point.x._2_2_ != cv_dex._2_2_) {
                    if (bLogErrors) {
                      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_glyph_outline.cpp"
                                 ,0xae4,"",
                                 "BeginFigure and interior point have different m_contour_index values."
                                );
                    }
                    return false;
                  }
                  if ((char)cv_dex == '\x06') {
                    bVar2 = ON_OutlineFigurePoint::IsOnFigure((ON_OutlineFigurePoint *)&cv_dex);
                    if (!bVar2) {
                      if (bLogErrors) {
                        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_glyph_outline.cpp"
                                   ,0xaec,"","LineTo point IsOnFigure() is false.");
                      }
                      return false;
                    }
                  }
                  else if ((char)cv_dex == '\a') {
                    bVar2 = ON_OutlineFigurePoint::IsOffFigure((ON_OutlineFigurePoint *)&cv_dex);
                    if (!bVar2) {
                      if (bLogErrors) {
                        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_glyph_outline.cpp"
                                   ,0xaf6,"",
                                   "Interior QuadraticBezier point IsOffFigure() is false.");
                      }
                      return false;
                    }
                    if (OVar3 <= local_64 + 1) {
                      if (bLogErrors) {
                        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_glyph_outline.cpp"
                                   ,0xafc,"","Invalid QuadraticBezier segment.");
                      }
                      return false;
                    }
                    local_64 = local_64 + 1;
                    pOVar5 = (ON_2fPoint *)((long)figure_start.m_point + (ulong)local_64 * 0xc);
                    _cv_dex = *pOVar5;
                    p1._0_4_ = pOVar5[1].x;
                    if (figure_end.m_point.x._2_2_ != cv_dex._2_2_) {
                      if (bLogErrors) {
                        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_glyph_outline.cpp"
                                   ,0xb03,"",
                                   "BeginFigure and interior point have different m_contour_index values."
                                  );
                      }
                      return false;
                    }
                    if ((char)cv_dex != '\a') {
                      if (bLogErrors) {
                        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_glyph_outline.cpp"
                                   ,0xb09,"","Invalid end of QuadraticBezier segment point type.");
                      }
                      return false;
                    }
                    bVar2 = ON_OutlineFigurePoint::IsOnFigure((ON_OutlineFigurePoint *)&cv_dex);
                    if (!bVar2) {
                      if (bLogErrors) {
                        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_glyph_outline.cpp"
                                   ,0xb0f,"","End of QuadraticBezier point IsOnFigure() is false.");
                      }
                      return false;
                    }
                  }
                  else {
                    if ((char)cv_dex != '\b') {
                      if (bLogErrors) {
                        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_glyph_outline.cpp"
                                   ,0xb46,"","Invalid point type for figure interior.");
                      }
                      return false;
                    }
                    bVar2 = ON_OutlineFigurePoint::IsOffFigure((ON_OutlineFigurePoint *)&cv_dex);
                    if (!bVar2) {
                      if (bLogErrors) {
                        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_glyph_outline.cpp"
                                   ,0xb19,"",
                                   "Interior CubicBezierPoint point IsOffFigure() is false.");
                      }
                      return false;
                    }
                    for (local_68 = 2; local_68 < 4; local_68 = local_68 + 1) {
                      if (OVar3 <= local_64 + 1) {
                        if (bLogErrors) {
                          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_glyph_outline.cpp"
                                     ,0xb21,"","Invalid CubicBezierPoint segment.");
                        }
                        return false;
                      }
                      local_64 = local_64 + 1;
                      pOVar5 = (ON_2fPoint *)((long)figure_start.m_point + (ulong)local_64 * 0xc);
                      _cv_dex = *pOVar5;
                      p1._0_4_ = pOVar5[1].x;
                      if (figure_end.m_point.x._2_2_ != cv_dex._2_2_) {
                        if (bLogErrors) {
                          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_glyph_outline.cpp"
                                     ,0xb28,"",
                                     "BeginFigure and interior point have different m_contour_index values."
                                    );
                        }
                        return false;
                      }
                      if ((char)cv_dex != '\b') {
                        if (bLogErrors) {
                          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_glyph_outline.cpp"
                                     ,0xb2e,"","Invalid end of QuadraticBezier segment point type.")
                          ;
                        }
                        return false;
                      }
                      if (local_68 == 2) {
                        bVar2 = ON_OutlineFigurePoint::IsOffFigure((ON_OutlineFigurePoint *)&cv_dex)
                        ;
                        if (!bVar2) {
                          if (bLogErrors) {
                            ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_glyph_outline.cpp"
                                       ,0xb36,"",
                                       "Interior CubicBezierPoint point IsOffFigure() is false.");
                          }
                          return false;
                        }
                      }
                      else {
                        bVar2 = ON_OutlineFigurePoint::IsOnFigure((ON_OutlineFigurePoint *)&cv_dex);
                        if (!bVar2) {
                          if (bLogErrors) {
                            ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_glyph_outline.cpp"
                                       ,0xb3e,"",
                                       "End of QuadraticBezier point IsOnFigure() is false.");
                          }
                          return false;
                        }
                      }
                    }
                  }
                }
                this_local._7_1_ = true;
              }
              else {
                if (bLogErrors) {
                  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_glyph_outline.cpp"
                             ,0xabf,"","EndFigure point IsOnFigure() is false.");
                }
                this_local._7_1_ = false;
              }
            }
            else {
              if (bLogErrors) {
                ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_glyph_outline.cpp"
                           ,0xab9,"","BeginFigure point IsOnFigure() is false.");
              }
              this_local._7_1_ = false;
            }
          }
          else {
            if (bLogErrors) {
              ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_glyph_outline.cpp"
                         ,0xab3,"",
                         "BeginFigure and EndFigure points have different m_contour_index values.");
            }
            this_local._7_1_ = false;
          }
        }
      }
    }
    else {
      if (bLogErrors) {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_glyph_outline.cpp"
                   ,0xa9f,"","m_points[0] is not a BeginFigure point.");
      }
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_OutlineFigure::IsValidFigure(
  bool bLogErrors
) const
{
  const ON__UINT32 figure_end_dex = Internal_FigureEndDex(bLogErrors);
  if (0 == figure_end_dex)
  {
    return false;
  }

  const ON_OutlineFigurePoint* a = m_points.Array();


  const ON_OutlineFigurePoint figure_start = a[0];
  if (false == figure_start.IsBeginFigurePoint())
  {
    if ( bLogErrors ) ON_ERROR("m_points[0] is not a BeginFigure point.");
    return false;
  }
  if ( ON_OutlineFigurePoint::Type::BeginFigureUnknown == figure_start.m_point_type)
  {
    // Finished figures never have BeginFigureUnknown point type.
    if ( bLogErrors ) ON_ERROR("m_outline_points[figure_start_dex] is ON_OutlineFigurePoint::Type::BeginFigureUnknown.");
    return false;
  }

  const ON__UINT16 figure_id = figure_start.m_figure_index;
  if (0 == figure_id)
  {
    if ( bLogErrors ) ON_ERROR("BeginFigure point has 0 = m_contour_index.");
    return false;
  }

  const ON_OutlineFigurePoint figure_end = a[figure_end_dex];
  if (figure_id != figure_end.m_figure_index)
  {
    if ( bLogErrors ) ON_ERROR("BeginFigure and EndFigure points have different m_contour_index values.");
    return false;
  }

  if ( false == figure_start.IsOnFigure())
  {
    if ( bLogErrors ) ON_ERROR("BeginFigure point IsOnFigure() is false.");
    return false;
  }

  if (false == figure_end.IsOnFigure())
  {
    if ( bLogErrors ) ON_ERROR("EndFigure point IsOnFigure() is false.");
    return false;
  }

  const bool bClosedFigure = (ON_OutlineFigurePoint::Type::BeginFigureOpen != figure_start.m_point_type);
  if (bClosedFigure)
  {
    if (ON_OutlineFigurePoint::Type::EndFigureClosed != figure_end.m_point_type)
    {
      if ( bLogErrors ) ON_ERROR("Closed figure is not terminated with an EndFigureClosed point.");
      return false;
    }
    if (false == (figure_start.m_point == figure_end.m_point))
    {
      if ( bLogErrors ) ON_ERROR("Closed figure has different start and end points.");
      return false;
    }
  }
  else
  {
    if (ON_OutlineFigurePoint::Type::EndFigureOpen != figure_end.m_point_type)
    {
      if ( bLogErrors ) ON_ERROR("Open figure is not terminated with an EndFigureOpen point.");
      return false;
    }
  }

  // Validate EndFigure bToPoint setting.

  ON_OutlineFigurePoint p0, p1;
  p1 = figure_start;
  for (ON__UINT32 i = 1; i < figure_end_dex; i++)
  {
    p0 = p1;
    p1 = a[i];
    if (figure_id != p1.m_figure_index)
    {
      if (bLogErrors) ON_ERROR("BeginFigure and interior point have different m_contour_index values.");
      return false;
    }
    
    if (ON_OutlineFigurePoint::Type::LineTo == p1.m_point_type)
    {
      if (false == p1.IsOnFigure())
      {
        if (bLogErrors) ON_ERROR("LineTo point IsOnFigure() is false.");
        return false;
      }
      continue;
    }

    if (ON_OutlineFigurePoint::Type::QuadraticBezierPoint == p1.m_point_type)
    {
      if (false == p1.IsOffFigure())
      {
        if (bLogErrors) ON_ERROR("Interior QuadraticBezier point IsOffFigure() is false.");
        return false;
      }

      if (i + 1 >= figure_end_dex)
      {
        if (bLogErrors) ON_ERROR("Invalid QuadraticBezier segment.");
        return false;
      }

      p1 = a[++i];
      if (figure_id != p1.m_figure_index)
      {
        if (bLogErrors) ON_ERROR("BeginFigure and interior point have different m_contour_index values.");
        return false;
      }

      if (ON_OutlineFigurePoint::Type::QuadraticBezierPoint != p1.m_point_type)
      {
        if (bLogErrors) ON_ERROR("Invalid end of QuadraticBezier segment point type.");
        return false;
      }

      if (false == p1.IsOnFigure())
      {
        if (bLogErrors) ON_ERROR("End of QuadraticBezier point IsOnFigure() is false.");
        return false;
      }
      continue;
    }

    if (ON_OutlineFigurePoint::Type::CubicBezierPoint == p1.m_point_type)
    {
      if (false == p1.IsOffFigure())
      {
        if (bLogErrors) ON_ERROR("Interior CubicBezierPoint point IsOffFigure() is false.");
        return false;
      }

      for (int cv_dex = 2; cv_dex <= 3; cv_dex++)
      {
        if (i + 1 >= figure_end_dex)
        {
          if (bLogErrors) ON_ERROR("Invalid CubicBezierPoint segment.");
          return false;
        }

        p1 = a[++i];
        if (figure_id != p1.m_figure_index)
        {
          if (bLogErrors) ON_ERROR("BeginFigure and interior point have different m_contour_index values.");
          return false;
        }

        if (ON_OutlineFigurePoint::Type::CubicBezierPoint != p1.m_point_type)
        {
          if (bLogErrors) ON_ERROR("Invalid end of QuadraticBezier segment point type.");
          return false;
        }

        if (2 == cv_dex)
        {
          if (false == p1.IsOffFigure())
          {
            if (bLogErrors) ON_ERROR("Interior CubicBezierPoint point IsOffFigure() is false.");
            return false;
          }
        }
        else
        {
          if (false == p1.IsOnFigure())
          {
            if (bLogErrors) ON_ERROR("End of QuadraticBezier point IsOnFigure() is false.");
            return false;
          }
        }
      }
      continue;
    }

    if (bLogErrors) ON_ERROR("Invalid point type for figure interior.");
    return false;
  }

  return true;
}